

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diagonal_precond.cc
# Opt level: O3

void __thiscall ipx::DiagonalPrecond::Factorize(DiagonalPrecond *this,double *W,Info *info)

{
  double dVar1;
  double dVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  Model *pMVar6;
  double *pdVar7;
  pointer piVar8;
  pointer piVar9;
  pointer pdVar10;
  size_t sVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  
  pMVar6 = this->model_;
  iVar3 = pMVar6->num_cols_;
  lVar15 = (long)iVar3;
  if (W == (double *)0x0) {
    sVar11 = (this->diagonal_)._M_size;
    pdVar7 = (this->diagonal_)._M_data;
    if (sVar11 != 0) {
      memset(pdVar7,0,sVar11 << 3);
    }
    if (0 < iVar3) {
      piVar8 = (pMVar6->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar12 = 0;
      do {
        iVar3 = piVar8[lVar12];
        lVar14 = (long)iVar3;
        iVar5 = piVar8[lVar12 + 1];
        if (iVar3 < iVar5) {
          piVar9 = (pMVar6->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = (pMVar6->AI_).values_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            dVar1 = pdVar10[lVar14];
            iVar3 = piVar9[lVar14];
            pdVar7[iVar3] = dVar1 * dVar1 + pdVar7[iVar3];
            lVar14 = lVar14 + 1;
          } while (iVar5 != lVar14);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar15);
    }
  }
  else {
    uVar4 = pMVar6->num_rows_;
    if (0 < (int)uVar4) {
      pdVar7 = (this->diagonal_)._M_data;
      uVar13 = 0;
      do {
        pdVar7[uVar13] = W[lVar15 + uVar13];
        uVar13 = uVar13 + 1;
      } while (uVar4 != uVar13);
    }
    if (0 < iVar3) {
      piVar8 = (pMVar6->AI_).colptr_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar7 = (this->diagonal_)._M_data;
      lVar12 = 0;
      do {
        iVar3 = piVar8[lVar12];
        lVar14 = (long)iVar3;
        iVar5 = piVar8[lVar12 + 1];
        if (iVar3 < iVar5) {
          dVar1 = W[lVar12];
          piVar9 = (pMVar6->AI_).rowidx_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = (pMVar6->AI_).values_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          do {
            dVar2 = pdVar10[lVar14];
            iVar3 = piVar9[lVar14];
            pdVar7[iVar3] = dVar1 * dVar2 * dVar2 + pdVar7[iVar3];
            lVar14 = lVar14 + 1;
          } while (iVar5 != lVar14);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 != lVar15);
    }
  }
  this->factorized_ = true;
  return;
}

Assistant:

void DiagonalPrecond::Factorize(const double* W, Info* info) {
    const Int m = model_.rows();
    const Int n = model_.cols();
    const SparseMatrix& AI = model_.AI();

    factorized_ = false;

    // Build diagonal of normal matrix.
    if (W) {
        for (Int i = 0; i < m; i++)
            diagonal_[i] = W[n+i];
        for (Int j = 0; j < n; j++) {
            double w = W[j];
            for (Int p = AI.begin(j); p < AI.end(j); p++)
                diagonal_[AI.index(p)] += AI.value(p) * w * AI.value(p);
        }
    } else {
        diagonal_ = 0.0;        // rightmost m columns have weight zero
        for (Int j = 0; j < n; j++) {
            for (Int p = AI.begin(j); p < AI.end(j); p++)
                diagonal_[AI.index(p)] += AI.value(p) * AI.value(p);
        }
    }

    factorized_ = true;
}